

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O2

UINT8 device_start_ym2203(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 clock;
  undefined8 *param;
  DEV_DATA *pDVar1;
  uint rate;
  
  clock = cfg->clock;
  rate = clock / 0x48;
  if (cfg->srMode == '\x02') {
    if (rate <= cfg->smplRate) {
      rate = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    rate = cfg->smplRate;
  }
  param = (undefined8 *)malloc(0x10);
  param[1] = 0;
  pDVar1 = (DEV_DATA *)ym2203_init(param,clock,rate,(FM_TIMERHANDLER)0x0,(FM_IRQHANDLER)0x0);
  *param = pDVar1;
  pDVar1->chipInf = param;
  retDevInf->dataPtr = pDVar1;
  retDevInf->sampleRate = rate;
  retDevInf->devDef = &devDef_MAME_2203;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  init_ssg_devinfo(retDevInf,cfg,'\x01',' ');
  return '\0';
}

Assistant:

static UINT8 device_start_ym2203(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	OPN_INF* info;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	info = (OPN_INF*)malloc(sizeof(OPN_INF));
	info->ssg = NULL;
	info->opn = ym2203_init(info, cfg->clock, rate, NULL, NULL);
	
	devData = (DEV_DATA*)info->opn;
	devData->chipInf = info;	// store pointer to OPN_INF into sound chip structure
	INIT_DEVINF(retDevInf, devData, rate, &devDef_MAME_2203);
	init_ssg_devinfo(retDevInf, cfg, 1, AYTYPE_YM2203);
	return 0x00;
}